

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StandardLibrary.h
# Opt level: O0

CodeLocation soul::getSystemModule(string_view moduleName)

{
  undefined1 __s [8];
  char *in_RDX;
  char *extraout_RDX;
  char *extraout_RDX_00;
  UTF8Reader UVar1;
  Ptr this;
  CodeLocation CVar2;
  string_view moduleName_00;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [24];
  undefined1 local_28 [8];
  char *code;
  string_view moduleName_local;
  
  local_40._8_8_ = moduleName._M_str;
  this.object = (SourceCodeText *)moduleName._M_len;
  moduleName_00._M_str = in_RDX;
  moduleName_00._M_len = (size_t)in_RDX;
  code = (char *)local_40._8_8_;
  moduleName_local._M_str = (char *)this.object;
  local_28 = (undefined1  [8])getSystemModuleCode((soul *)local_40._8_8_,moduleName_00);
  if (local_28 == (undefined1  [8])0x0) {
    memset(this.object,0,0x10);
    CodeLocation::CodeLocation((CodeLocation *)this.object);
    UVar1.data = extraout_RDX_00;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_60,(basic_string_view<char,_std::char_traits<char>_> *)&code,
               &local_61);
    __s = local_28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,(char *)__s,&local_99);
    SourceCodeText::createInternal((SourceCodeText *)local_40,&local_60,&local_98);
    CodeLocation::CodeLocation((CodeLocation *)this.object,(Ptr *)local_40);
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
              ((RefCountedPtr<soul::SourceCodeText> *)local_40);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    UVar1.data = extraout_RDX;
  }
  CVar2.location.data = UVar1.data;
  CVar2.sourceCode.object = this.object;
  return CVar2;
}

Assistant:

inline CodeLocation getSystemModule (std::string_view moduleName)
{
    if (auto code = getSystemModuleCode (moduleName))
        return SourceCodeText::createInternal (std::string (moduleName), code);

    return {};
}